

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void do_cmd_knowledge_traps(char *name,wchar_t row)

{
  group_funcs g_funcs;
  member_funcs o_funcs;
  int *obj_list;
  int local_88;
  wchar_t local_84;
  wchar_t i;
  wchar_t t_count;
  int *traps;
  member_funcs trap_f;
  group_funcs tkind_f;
  wchar_t row_local;
  char *name_local;
  
  memcpy(&trap_f.is_visual,&PTR_tkind_name_00362a20,0x28);
  memcpy(&traps,&PTR_display_trap_00362a48,0x38);
  local_84 = L'\0';
  obj_list = (int *)mem_zalloc((ulong)z_info->trap_max << 2);
  for (local_88 = 0; local_88 < (int)(uint)z_info->trap_max; local_88 = local_88 + 1) {
    if (trap_info[local_88].name != (char *)0x0) {
      obj_list[local_84] = local_88;
      local_84 = local_84 + L'\x01';
    }
  }
  g_funcs.gcomp = (_func_wchar_t_void_ptr_void_ptr *)tkind_f.name;
  g_funcs.name = (_func_char_ptr_wchar_t *)trap_f._48_8_;
  g_funcs.group = (_func_wchar_t_wchar_t *)tkind_f.gcomp;
  g_funcs.summary = (_func_void_wchar_t_wchar_t_ptr_wchar_t_wchar_t_wchar_t_wchar_t *)tkind_f.group;
  g_funcs._32_8_ = tkind_f.summary;
  o_funcs.lore = (_func_void_wchar_t *)trap_f.display_member;
  o_funcs.display_member = (_func_void_wchar_t_wchar_t__Bool_wchar_t *)traps;
  o_funcs.xchar = (_func_wchar_t_ptr_wchar_t *)trap_f.lore;
  o_funcs.xattr = (_func_uint8_t_ptr_wchar_t *)trap_f.xchar;
  o_funcs.xtra_prompt = (_func_char_ptr_wchar_t *)trap_f.xattr;
  o_funcs.xtra_act = (_func_void_keypress_wchar_t *)trap_f.xtra_prompt;
  o_funcs._48_8_ = trap_f.xtra_act;
  display_knowledge("traps",obj_list,local_84,g_funcs,o_funcs,"                    Sym");
  mem_free(obj_list);
  return;
}

Assistant:

static void do_cmd_knowledge_traps(const char *name, int row)
{
	group_funcs tkind_f = {tkind_name, t_cmp_tkind, trap_order, 0,
						   N_ELEMENTS(trap_group_text), false};

	member_funcs trap_f = {display_trap, trap_lore, t_xchar, t_xattr,
						   trap_prompt, t_xtra_act, 0};

	int *traps;
	int t_count = 0;
	int i;

	traps = mem_zalloc(z_info->trap_max * sizeof(int));

	for (i = 0; i < z_info->trap_max; i++) {
		if (!trap_info[i].name) continue;

		traps[t_count++] = i;
	}

	display_knowledge("traps", traps, t_count, tkind_f, trap_f,
					  "                    Sym");
	mem_free(traps);
}